

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::b_formatter<spdlog::details::null_scoped_padder>::format
          (b_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  const_reference ppcVar1;
  size_t sVar2;
  memory_buf_t *in_RCX;
  array<const_char_*,_12UL> *in_RDI;
  null_scoped_padder p;
  string_view_t field_value;
  size_type in_stack_ffffffffffffff98;
  undefined1 *puVar3;
  char *in_stack_ffffffffffffffb8;
  char_type *__s;
  memory_buf_t *local_38;
  
  ppcVar1 = std::array<const_char_*,_12UL>::operator[](in_RDI,in_stack_ffffffffffffff98);
  __s = *ppcVar1;
  puVar3 = &stack0xffffffffffffffc0;
  sVar2 = std::char_traits<char>::length(__s);
  *(size_t *)(puVar3 + 8) = sVar2;
  sVar2 = ::fmt::v8::basic_string_view<char>::size
                    ((basic_string_view<char> *)&stack0xffffffffffffffc0);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffbf,sVar2,
             (padding_info *)(in_RDI->_M_elems + 1),in_RCX);
  view.size_ = (size_t)__s;
  view.data_ = in_stack_ffffffffffffffb8;
  fmt_helper::append_string_view(view,local_38);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{months[static_cast<size_t>(tm_time.tm_mon)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }